

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxCollision.h
# Opt level: O3

void __thiscall
cbtAABB::cbtAABB(cbtAABB *this,cbtVector3 *V1,cbtVector3 *V2,cbtVector3 *V3,cbtScalar margin)

{
  cbtScalar *pcVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtVector3 *pcVar8;
  cbtScalar *pcVar9;
  cbtScalar *pcVar10;
  cbtScalar *pcVar11;
  cbtScalar *pcVar12;
  
  fVar2 = V2->m_floats[0];
  pcVar8 = V2;
  if (V3->m_floats[0] < fVar2) {
    pcVar8 = V3;
    fVar2 = V3->m_floats[0];
  }
  if (V1->m_floats[0] <= fVar2) {
    pcVar8 = V1;
  }
  fVar2 = pcVar8->m_floats[0];
  pcVar10 = V2->m_floats + 1;
  (this->m_min).m_floats[0] = fVar2;
  fVar3 = V2->m_floats[1];
  pcVar9 = pcVar10;
  if (V3->m_floats[1] < fVar3) {
    pcVar9 = V3->m_floats + 1;
    fVar3 = V3->m_floats[1];
  }
  if (V1->m_floats[1] <= fVar3) {
    pcVar9 = V1->m_floats + 1;
  }
  fVar3 = *pcVar9;
  pcVar9 = V1->m_floats + 2;
  pcVar11 = V2->m_floats + 2;
  pcVar1 = V3->m_floats + 2;
  (this->m_min).m_floats[1] = fVar3;
  fVar4 = V2->m_floats[2];
  pcVar12 = pcVar11;
  if (V3->m_floats[2] < fVar4) {
    pcVar12 = pcVar1;
    fVar4 = V3->m_floats[2];
  }
  if (V1->m_floats[2] <= fVar4) {
    pcVar12 = pcVar9;
  }
  fVar4 = *pcVar12;
  (this->m_min).m_floats[2] = fVar4;
  fVar5 = V2->m_floats[0];
  pcVar8 = V2;
  if (fVar5 < V3->m_floats[0]) {
    pcVar8 = V3;
    fVar5 = V3->m_floats[0];
  }
  if (fVar5 <= V1->m_floats[0]) {
    pcVar8 = V1;
  }
  fVar5 = pcVar8->m_floats[0];
  (this->m_max).m_floats[0] = fVar5;
  fVar6 = V2->m_floats[1];
  if (fVar6 < V3->m_floats[1]) {
    pcVar10 = V3->m_floats + 1;
    fVar6 = V3->m_floats[1];
  }
  if (fVar6 <= V1->m_floats[1]) {
    pcVar10 = V1->m_floats + 1;
  }
  fVar6 = *pcVar10;
  (this->m_max).m_floats[1] = fVar6;
  fVar7 = *pcVar11;
  if (fVar7 < *pcVar1) {
    pcVar11 = pcVar1;
    fVar7 = *pcVar1;
  }
  if (fVar7 <= *pcVar9) {
    pcVar11 = pcVar9;
  }
  fVar7 = *pcVar11;
  (this->m_min).m_floats[0] = fVar2 - margin;
  (this->m_min).m_floats[1] = fVar3 - margin;
  (this->m_min).m_floats[2] = fVar4 - margin;
  (this->m_max).m_floats[0] = fVar5 + margin;
  (this->m_max).m_floats[1] = fVar6 + margin;
  (this->m_max).m_floats[2] = margin + fVar7;
  return;
}

Assistant:

cbtAABB(const cbtVector3 &V1,
		   const cbtVector3 &V2,
		   const cbtVector3 &V3,
		   cbtScalar margin)
	{
		m_min[0] = BT_MIN3(V1[0], V2[0], V3[0]);
		m_min[1] = BT_MIN3(V1[1], V2[1], V3[1]);
		m_min[2] = BT_MIN3(V1[2], V2[2], V3[2]);

		m_max[0] = BT_MAX3(V1[0], V2[0], V3[0]);
		m_max[1] = BT_MAX3(V1[1], V2[1], V3[1]);
		m_max[2] = BT_MAX3(V1[2], V2[2], V3[2]);

		m_min[0] -= margin;
		m_min[1] -= margin;
		m_min[2] -= margin;
		m_max[0] += margin;
		m_max[1] += margin;
		m_max[2] += margin;
	}